

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int uv__tcp_connect(uv_connect_t *req,uv_tcp_t *handle,sockaddr *addr,uint addrlen,uv_connect_cb cb)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int r;
  int err;
  uv_connect_cb cb_local;
  uint addrlen_local;
  sockaddr *addr_local;
  uv_tcp_t *handle_local;
  uv_connect_t *req_local;
  
  if (handle->type != UV_TCP) {
    __assert_fail("handle->type == UV_TCP",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/tcp.c"
                  ,0x99,
                  "int uv__tcp_connect(uv_connect_t *, uv_tcp_t *, const struct sockaddr *, unsigned int, uv_connect_cb)"
                 );
  }
  if (handle->connect_req == (uv_connect_t *)0x0) {
    req_local._4_4_ = maybe_new_socket(handle,(uint)addr->sa_family,0x60);
    if (req_local._4_4_ == 0) {
      handle->delayed_error = 0;
      do {
        piVar2 = __errno_location();
        *piVar2 = 0;
        iVar1 = connect((handle->io_watcher).fd,(sockaddr *)addr,addrlen);
        bVar3 = false;
        if (iVar1 == -1) {
          piVar2 = __errno_location();
          bVar3 = *piVar2 == 4;
        }
      } while (bVar3);
      if (((iVar1 == -1) && (piVar2 = __errno_location(), *piVar2 != 0)) &&
         (piVar2 = __errno_location(), *piVar2 != 0x73)) {
        piVar2 = __errno_location();
        if (*piVar2 != 0x6f) {
          piVar2 = __errno_location();
          return -*piVar2;
        }
        piVar2 = __errno_location();
        handle->delayed_error = -*piVar2;
      }
      req->type = UV_CONNECT;
      req->active_queue[0] = handle->loop->active_reqs;
      req->active_queue[1] = handle->loop->active_reqs[1];
      *(void ***)req->active_queue[1] = req->active_queue;
      handle->loop->active_reqs[1] = req->active_queue;
      req->cb = cb;
      req->handle = (uv_stream_t *)handle;
      req->queue[0] = req->queue;
      req->queue[1] = req->queue;
      handle->connect_req = req;
      uv__io_start(handle->loop,&handle->io_watcher,4);
      if (handle->delayed_error != 0) {
        uv__io_feed(handle->loop,&handle->io_watcher);
      }
      req_local._4_4_ = 0;
    }
  }
  else {
    req_local._4_4_ = -0x72;
  }
  return req_local._4_4_;
}

Assistant:

int uv__tcp_connect(uv_connect_t* req,
                    uv_tcp_t* handle,
                    const struct sockaddr* addr,
                    unsigned int addrlen,
                    uv_connect_cb cb) {
  int err;
  int r;

  assert(handle->type == UV_TCP);

  if (handle->connect_req != NULL)
    return -EALREADY;  /* FIXME(bnoordhuis) -EINVAL or maybe -EBUSY. */

  err = maybe_new_socket(handle,
                         addr->sa_family,
                         UV_STREAM_READABLE | UV_STREAM_WRITABLE);
  if (err)
    return err;

  handle->delayed_error = 0;

  do {
    errno = 0;
    r = connect(uv__stream_fd(handle), addr, addrlen);
  } while (r == -1 && errno == EINTR);

  /* We not only check the return value, but also check the errno != 0.
   * Because in rare cases connect() will return -1 but the errno
   * is 0 (for example, on Android 4.3, OnePlus phone A0001_12_150227)
   * and actually the tcp three-way handshake is completed.
   */
  if (r == -1 && errno != 0) {
    if (errno == EINPROGRESS)
      ; /* not an error */
    else if (errno == ECONNREFUSED)
    /* If we get a ECONNREFUSED wait until the next tick to report the
     * error. Solaris wants to report immediately--other unixes want to
     * wait.
     */
      handle->delayed_error = -errno;
    else
      return -errno;
  }

  uv__req_init(handle->loop, req, UV_CONNECT);
  req->cb = cb;
  req->handle = (uv_stream_t*) handle;
  QUEUE_INIT(&req->queue);
  handle->connect_req = req;

  uv__io_start(handle->loop, &handle->io_watcher, POLLOUT);

  if (handle->delayed_error)
    uv__io_feed(handle->loop, &handle->io_watcher);

  return 0;
}